

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmpa<(moira::Instr)38,(moira::Mode)5,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 in_EAX;
  u32 local_18;
  u32 ea;
  
  local_18 = in_EAX;
  bVar1 = readOp<(moira::Mode)5,(moira::Size)4,128ul>(this,opcode & 7,&ea,&local_18);
  if (bVar1) {
    cmp<(moira::Size)4>(this,local_18,
                        *(u32 *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x38));
    prefetch<4ul>(this);
    (*this->_vptr_Moira[0x19])(this,2);
  }
  return;
}

Assistant:

void
Moira::execCmpa(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    data = SEXT<S>(data);
    cmp<Long>(data, readA(dst));
    prefetch<POLLIPL>();

    sync(2);
}